

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int upsampled_pref_error
              (MACROBLOCKD *xd,AV1_COMMON *cm,MV *this_mv,SUBPEL_SEARCH_VAR_PARAMS *var_params,
              uint *sse)

{
  byte bVar1;
  int ref_stride;
  int iVar2;
  int mask_stride;
  int invert_mask;
  int width;
  int height;
  int mi_row;
  int mi_col;
  aom_variance_fn_ptr_t *paVar3;
  buf_2d *pbVar4;
  buf_2d *pbVar5;
  uint8_t *puVar6;
  uint8_t *pred8;
  uint8_t *mask;
  uint8_t *ref8;
  uint uVar7;
  uint8_t *comp_pred8;
  uint subpel_y_q3;
  uint8_t pred [16384];
  
  paVar3 = var_params->vfp;
  pbVar4 = (var_params->ms_buffers).ref;
  bVar1 = var_params->subpel_search_type;
  pbVar5 = (var_params->ms_buffers).src;
  puVar6 = pbVar5->buf;
  ref_stride = pbVar4->stride;
  iVar2 = pbVar5->stride;
  pred8 = (var_params->ms_buffers).second_pred;
  mask = (var_params->ms_buffers).mask;
  mask_stride = (var_params->ms_buffers).mask_stride;
  invert_mask = (var_params->ms_buffers).inv_mask;
  width = var_params->w;
  height = var_params->h;
  mi_row = xd->mi_row;
  mi_col = xd->mi_col;
  ref8 = pbVar4->buf + (((int)*this_mv >> 0x13) + ((int)(*this_mv).row >> 3) * ref_stride);
  uVar7 = (ushort)this_mv->col & 7;
  subpel_y_q3 = (ushort)this_mv->row & 7;
  if ((xd->cur_buf->flags & 8) == 0) {
    if (pred8 == (uint8_t *)0x0) {
      aom_upsampled_pred_sse2
                (xd,cm,mi_row,mi_col,this_mv,pred,width,height,uVar7,subpel_y_q3,ref8,ref_stride,
                 (uint)bVar1);
    }
    else if (mask == (uint8_t *)0x0) {
      aom_comp_avg_upsampled_pred_sse2
                (xd,cm,mi_row,mi_col,this_mv,pred,pred8,width,height,uVar7,subpel_y_q3,ref8,
                 ref_stride,(uint)bVar1);
    }
    else {
      aom_comp_mask_upsampled_pred
                (xd,cm,mi_row,mi_col,this_mv,pred,pred8,width,height,uVar7,subpel_y_q3,ref8,
                 ref_stride,mask,mask_stride,invert_mask,(uint)bVar1);
    }
    comp_pred8 = pred;
  }
  else {
    comp_pred8 = (uint8_t *)((ulong)pred >> 1);
    if (pred8 == (uint8_t *)0x0) {
      aom_highbd_upsampled_pred_sse2
                (xd,cm,mi_row,mi_col,this_mv,comp_pred8,width,height,uVar7,subpel_y_q3,ref8,
                 ref_stride,xd->bd,(uint)bVar1);
    }
    else if (mask == (uint8_t *)0x0) {
      aom_highbd_comp_avg_upsampled_pred_sse2
                (xd,cm,mi_row,mi_col,this_mv,comp_pred8,pred8,width,height,uVar7,subpel_y_q3,ref8,
                 ref_stride,xd->bd,(uint)bVar1);
    }
    else {
      aom_highbd_comp_mask_upsampled_pred
                (xd,cm,mi_row,mi_col,this_mv,comp_pred8,pred8,width,height,uVar7,subpel_y_q3,ref8,
                 ref_stride,mask,mask_stride,invert_mask,xd->bd,(uint)bVar1);
    }
  }
  uVar7 = (*paVar3->vf)(comp_pred8,width,puVar6,iVar2,sse);
  return uVar7;
}

Assistant:

static int upsampled_pref_error(MACROBLOCKD *xd, const AV1_COMMON *cm,
                                const MV *this_mv,
                                const SUBPEL_SEARCH_VAR_PARAMS *var_params,
                                unsigned int *sse) {
  const aom_variance_fn_ptr_t *vfp = var_params->vfp;
  const SUBPEL_SEARCH_TYPE subpel_search_type = var_params->subpel_search_type;

  const MSBuffers *ms_buffers = &var_params->ms_buffers;
  const uint8_t *src = ms_buffers->src->buf;
  const uint8_t *ref = get_buf_from_mv(ms_buffers->ref, *this_mv);
  const int src_stride = ms_buffers->src->stride;
  const int ref_stride = ms_buffers->ref->stride;
  const uint8_t *second_pred = ms_buffers->second_pred;
  const uint8_t *mask = ms_buffers->mask;
  const int mask_stride = ms_buffers->mask_stride;
  const int invert_mask = ms_buffers->inv_mask;
  const int w = var_params->w;
  const int h = var_params->h;

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int subpel_x_q3 = get_subpel_part(this_mv->col);
  const int subpel_y_q3 = get_subpel_part(this_mv->row);

  unsigned int besterr;
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    DECLARE_ALIGNED(16, uint16_t, pred16[MAX_SB_SQUARE]);
    uint8_t *pred8 = CONVERT_TO_BYTEPTR(pred16);
    if (second_pred != NULL) {
      if (mask) {
        aom_highbd_comp_mask_upsampled_pred(
            xd, cm, mi_row, mi_col, this_mv, pred8, second_pred, w, h,
            subpel_x_q3, subpel_y_q3, ref, ref_stride, mask, mask_stride,
            invert_mask, xd->bd, subpel_search_type);
      } else {
        aom_highbd_comp_avg_upsampled_pred(
            xd, cm, mi_row, mi_col, this_mv, pred8, second_pred, w, h,
            subpel_x_q3, subpel_y_q3, ref, ref_stride, xd->bd,
            subpel_search_type);
      }
    } else {
      aom_highbd_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred8, w, h,
                                subpel_x_q3, subpel_y_q3, ref, ref_stride,
                                xd->bd, subpel_search_type);
    }
    besterr = vfp->vf(pred8, w, src, src_stride, sse);
  } else {
    DECLARE_ALIGNED(16, uint8_t, pred[MAX_SB_SQUARE]);
    if (second_pred != NULL) {
      if (mask) {
        aom_comp_mask_upsampled_pred(
            xd, cm, mi_row, mi_col, this_mv, pred, second_pred, w, h,
            subpel_x_q3, subpel_y_q3, ref, ref_stride, mask, mask_stride,
            invert_mask, subpel_search_type);
      } else {
        aom_comp_avg_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred,
                                    second_pred, w, h, subpel_x_q3, subpel_y_q3,
                                    ref, ref_stride, subpel_search_type);
      }
    } else {
      aom_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred, w, h,
                         subpel_x_q3, subpel_y_q3, ref, ref_stride,
                         subpel_search_type);
    }

    besterr = vfp->vf(pred, w, src, src_stride, sse);
  }
#else
  DECLARE_ALIGNED(16, uint8_t, pred[MAX_SB_SQUARE]);
  if (second_pred != NULL) {
    if (mask) {
      aom_comp_mask_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred,
                                   second_pred, w, h, subpel_x_q3, subpel_y_q3,
                                   ref, ref_stride, mask, mask_stride,
                                   invert_mask, subpel_search_type);
    } else {
      aom_comp_avg_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred,
                                  second_pred, w, h, subpel_x_q3, subpel_y_q3,
                                  ref, ref_stride, subpel_search_type);
    }
  } else {
    aom_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred, w, h, subpel_x_q3,
                       subpel_y_q3, ref, ref_stride, subpel_search_type);
  }

  besterr = vfp->vf(pred, w, src, src_stride, sse);
#endif
  return besterr;
}